

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O0

JSONNode __thiscall ser::FieldsTable::TableToJSON(FieldsTable *this)

{
  bool bVar1;
  pointer ppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
  *in_RSI;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  const_iterator iter;
  allocator local_41;
  json_string local_40;
  undefined1 local_1d;
  int local_1c;
  int id;
  FieldsTable *this_local;
  JSONNode *node;
  
  local_1c = 0;
  local_1d = 0;
  this_local = this;
  ::JSONNode::JSONNode((JSONNode *)this,'\x04');
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"FieldsTable",&local_41);
  ::JSONNode::set_name((JSONNode *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = (undefined1  [8])
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
             ::begin(in_RSI);
  while( true ) {
    local_70._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
         ::end(in_RSI);
    bVar1 = std::operator!=((_Self *)local_60,(_Self *)(local_70 + 8));
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
                           *)local_60);
    local_1c = local_1c + 1;
    DataFieldInfo::ToJSON((DataFieldInfo *)local_70,(int)ppVar2 + 0x20);
    ::JSONNode::push_back((JSONNode *)this,(JSONNode *)local_70);
    ::JSONNode::~JSONNode((JSONNode *)local_70);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
                  *)local_60);
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode FieldsTable::TableToJSON() const
{
    int id = 0;
    JSONNode node(JSON_ARRAY);
    node.set_name("FieldsTable");
    for (std::map<std::string, DataFieldInfo>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        node.push_back(iter->second.ToJSON(id++));
    }
    return node;
}